

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_shifted_register.c
# Opt level: O3

void move_shifted_register(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  uint uVar1;
  uint32_t data;
  status_register_t *psVar2;
  ushort uVar3;
  uint32_t shift_amount;
  shift_type_t sVar4;
  
  uVar3 = thminstr->raw;
  switch(uVar3 >> 0xb & 3) {
  case 0:
    data = *(uint32_t *)((long)state->r + (ulong)(uVar3 >> 1 & 0x1c));
    shift_amount = uVar3 >> 6 & 0x1f;
    if ((uVar3 >> 6 & 0x1f) != 0) {
      sVar4 = LSL;
LAB_0010d653:
      uVar1 = arm_shift(&state->cpsr,sVar4,data,shift_amount);
      goto LAB_0010d68f;
    }
    sVar4 = LSL;
    break;
  case 1:
    data = *(uint32_t *)((long)state->r + (ulong)(uVar3 >> 1 & 0x1c));
    uVar3 = uVar3 >> 6 & 0x1f;
    if (uVar3 != 0) {
      sVar4 = LSR;
LAB_0010d651:
      shift_amount = (uint32_t)uVar3;
      goto LAB_0010d653;
    }
    sVar4 = LSR;
    break;
  case 2:
    data = state->r[uVar3 >> 3 & 7];
    uVar3 = uVar3 >> 6 & 0x1f;
    if (uVar3 != 0) {
      sVar4 = ASR;
      goto LAB_0010d651;
    }
    sVar4 = ASR;
    break;
  case 3:
    move_shifted_register_cold_1();
  }
  uVar1 = arm_shift_special_zero_behavior(state,&state->cpsr,sVar4,data);
LAB_0010d68f:
  uVar3 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar3 & 7),(ulong)uVar1);
  }
  state->r[uVar3 & 7] = uVar1;
  psVar2 = get_psr(state);
  psVar2->raw = uVar1 & 0x80000000 | (uint)(uVar1 == 0) << 0x1e | psVar2->raw & 0x3fffffff;
  return;
}

Assistant:

void move_shifted_register(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    move_shifted_register_t* instr = &thminstr->MOVE_SHIFTED_REGISTER;
    switch (instr->opcode) {
        case 0: { // LSL
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, LSL, value);
            } else {
                value = arm_shift(&state->cpsr, LSL, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        case 1: { // LSR
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, LSR, value);
            } else {
                value = arm_shift(&state->cpsr, LSR, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        case 2: { // ASR
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, ASR, value);
            } else {
                value = arm_shift(&state->cpsr, ASR, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        default:
            logfatal("Unknown MSR opcode: %d", instr->opcode)
    }
}